

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

SummaryColumn * __thiscall
Catch::anon_unknown_26::SummaryColumn::addRow(SummaryColumn *this,uint64_t count)

{
  ulong uVar1;
  pointer pbVar2;
  bool bVar3;
  ulong uVar4;
  char cVar5;
  uint64_t uVar6;
  char cVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *oldRow;
  pointer pbVar8;
  ulong uVar9;
  string row;
  value_type local_48;
  
  cVar7 = '\x01';
  if (9 < count) {
    uVar6 = count;
    cVar5 = '\x04';
    do {
      cVar7 = cVar5;
      if (uVar6 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_0013cca9;
      }
      if (uVar6 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_0013cca9;
      }
      if (uVar6 < 10000) goto LAB_0013cca9;
      bVar3 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar5 = cVar7 + '\x04';
    } while (bVar3);
    cVar7 = cVar7 + '\x01';
  }
LAB_0013cca9:
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_48._M_dataplus._M_p,(uint)local_48._M_string_length,count);
  uVar4 = CONCAT44(local_48._M_string_length._4_4_,(uint)local_48._M_string_length);
  uVar1 = this->m_width;
  uVar9 = uVar4;
  if (uVar4 <= uVar1 && uVar1 - uVar4 != 0) {
    uVar9 = uVar1;
  }
  if (uVar4 <= uVar1) {
    std::__cxx11::string::insert((ulong)&local_48,0,(char)(uVar1 - uVar4));
  }
  else {
    pbVar2 = (this->m_rows).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar8 = (this->m_rows).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2; pbVar8 = pbVar8 + 1)
    {
      std::__cxx11::string::insert((ulong)pbVar8,0,(char)uVar9 - (char)this->m_width);
    }
  }
  this->m_width = uVar9;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_rows,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

SummaryColumn&& addRow( std::uint64_t count ) && {
                std::string row = std::to_string(count);
                auto const new_width = std::max( m_width, row.size() );
                if ( new_width > m_width ) {
                    for ( auto& oldRow : m_rows ) {
                        oldRow.insert( 0, new_width - m_width, ' ' );
                    }
                } else {
                    row.insert( 0, m_width - row.size(), ' ' );
                }
                m_width = new_width;
                m_rows.push_back( row );
                return std::move( *this );
            }